

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform.cc
# Opt level: O1

bool __thiscall
sptk::FastFourierTransform::Run
          (FastFourierTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  double *pdVar9;
  double *pdVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  size_t sVar20;
  int iVar21;
  double *pdVar22;
  pointer __s;
  pointer pdVar23;
  uint uVar24;
  double *pdVar25;
  uint uVar26;
  int iVar27;
  double *pdVar28;
  double *pdVar29;
  ulong uVar30;
  bool bVar31;
  double dVar32;
  
  if (this->is_valid_ == true) {
    lVar16 = (long)this->num_order_ + 1;
    if ((long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == lVar16) {
      bVar12 = false;
      if (((imag_part_output != (vector<double,_std::allocator<double>_> *)0x0) &&
          (bVar12 = false, real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
         (bVar12 = false,
         (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == lVar16)) {
        if ((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
          std::vector<double,_std::allocator<double>_>::resize
                    (real_part_output,(long)this->fft_length_);
        }
        if ((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
          std::vector<double,_std::allocator<double>_>::resize
                    (imag_part_output,(long)this->fft_length_);
        }
        pdVar6 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar20 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6;
        if (sVar20 != 0) {
          memmove((real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,pdVar6,sVar20);
        }
        pdVar6 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar8 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar23 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        __s = (pointer)((long)pdVar23 + ((long)pdVar6 - (long)pdVar8));
        if (__s != pdVar7) {
          memset(__s,0,((long)pdVar7 + (long)pdVar8 + (-8 - ((long)pdVar6 + (long)pdVar23)) &
                       0xfffffffffffffff8U) + 8);
        }
        pdVar6 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar20 = (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6;
        if (sVar20 != 0) {
          memmove((imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,pdVar6,sVar20);
        }
        pdVar9 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar7 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar23 = (pointer)(((long)pdVar8 - (long)pdVar7) + (long)pdVar9);
        if (pdVar23 != pdVar6) {
          memset(pdVar23,0,
                 ((long)pdVar6 + (long)pdVar7 + (-8 - ((long)pdVar8 + (long)pdVar9)) &
                 0xfffffffffffffff8U) + 8);
        }
        pdVar10 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar4 = this->fft_length_;
        uVar5 = this->half_fft_length_;
        if (1 < (int)uVar5) {
          pdVar25 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar15 = uVar4 + 3;
          if (-1 < (int)uVar4) {
            uVar15 = uVar4;
          }
          iVar13 = 1;
          uVar26 = uVar4;
          uVar24 = uVar5;
          do {
            uVar30 = 1;
            if (1 < (int)uVar24) {
              uVar30 = (ulong)uVar24;
            }
            uVar14 = 0;
            pdVar18 = pdVar10;
            pdVar29 = pdVar9;
            uVar11 = uVar26;
            pdVar28 = pdVar9;
            pdVar19 = pdVar25;
            pdVar22 = pdVar25 + ((int)uVar15 >> 2);
            pdVar17 = pdVar10;
            do {
              for (; (int)uVar11 <= (int)uVar4; uVar11 = uVar11 + uVar26) {
                dVar32 = *pdVar18 - pdVar18[uVar24];
                dVar1 = *pdVar29;
                dVar2 = pdVar29[uVar24];
                *pdVar18 = *pdVar18 + pdVar18[uVar24];
                *pdVar29 = pdVar29[uVar24] + *pdVar29;
                pdVar18[uVar24] = *pdVar22 * dVar32 + *pdVar19 * (dVar1 - dVar2);
                pdVar29[uVar24] = (dVar1 - dVar2) * *pdVar22 - dVar32 * *pdVar19;
                pdVar18 = pdVar18 + (int)uVar26;
                pdVar29 = pdVar29 + (int)uVar26;
              }
              pdVar19 = pdVar19 + iVar13;
              pdVar22 = pdVar22 + iVar13;
              uVar14 = uVar14 + 1;
              pdVar29 = pdVar28 + 1;
              pdVar18 = pdVar17 + 1;
              uVar11 = uVar26;
              pdVar28 = pdVar29;
              pdVar17 = pdVar18;
            } while (uVar14 != uVar30);
            iVar13 = iVar13 * 2;
            bVar12 = 3 < uVar24;
            uVar26 = uVar24;
            uVar24 = uVar24 >> 1;
          } while (bVar12);
        }
        if (0 < (int)uVar5) {
          lVar16 = 0;
          uVar15 = uVar5;
          do {
            dVar1 = *(double *)((long)pdVar10 + lVar16);
            dVar2 = *(double *)((long)pdVar10 + lVar16 + 8);
            dVar32 = *(double *)((long)pdVar9 + lVar16);
            dVar3 = *(double *)((long)pdVar9 + lVar16 + 8);
            *(double *)((long)pdVar10 + lVar16) = dVar1 + dVar2;
            *(double *)((long)pdVar9 + lVar16) =
                 *(double *)((long)pdVar9 + lVar16 + 8) + *(double *)((long)pdVar9 + lVar16);
            *(double *)((long)pdVar10 + lVar16 + 8) = dVar1 - dVar2;
            *(double *)((long)pdVar9 + lVar16 + 8) = dVar32 - dVar3;
            lVar16 = lVar16 + 0x10;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        bVar12 = true;
        if (1 < (int)uVar4) {
          iVar21 = 0;
          pdVar19 = pdVar9;
          pdVar25 = pdVar10;
          iVar13 = 0;
          do {
            iVar27 = iVar13 - iVar21;
            if (iVar27 < 0) {
              dVar1 = *pdVar25;
              dVar2 = *pdVar19;
              *pdVar25 = pdVar25[iVar27];
              *pdVar19 = pdVar19[iVar27];
              pdVar25[iVar27] = dVar1;
              pdVar19[iVar27] = dVar2;
            }
            uVar15 = uVar5;
            if ((int)uVar5 <= iVar21) {
              do {
                iVar21 = iVar21 - uVar15;
                uVar15 = (int)uVar15 / 2;
              } while ((int)uVar15 <= iVar21);
            }
            iVar21 = iVar21 + uVar15;
            pdVar25 = pdVar10 + iVar21;
            pdVar19 = pdVar9 + iVar21;
            bVar31 = iVar13 != uVar4 - 2;
            iVar13 = iVar13 + 1;
          } while (bVar31);
        }
      }
    }
    else {
      bVar12 = false;
    }
    return bVar12;
  }
  return false;
}

Assistant:

bool FastFourierTransform::Run(const std::vector<double>& real_part_input,
                               const std::vector<double>& imag_part_input,
                               std::vector<double>* real_part_output,
                               std::vector<double>* imag_part_output) const {
  // Check inputs.
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(num_order_ + 1) ||
      imag_part_input.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == real_part_output || NULL == imag_part_output) {
    return false;
  }

  // Prepare memories.
  if (real_part_output->size() != static_cast<std::size_t>(fft_length_)) {
    real_part_output->resize(fft_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(fft_length_)) {
    imag_part_output->resize(fft_length_);
  }

  // Copy inputs and fill zero.
  std::copy(real_part_input.begin(), real_part_input.end(),
            real_part_output->begin());
  std::fill(real_part_output->begin() + real_part_input.size(),
            real_part_output->end(), 0.0);
  std::copy(imag_part_input.begin(), imag_part_input.end(),
            imag_part_output->begin());
  std::fill(imag_part_output->begin() + imag_part_input.size(),
            imag_part_output->end(), 0.0);

  double* x(&((*real_part_output)[0]));
  double* y(&((*imag_part_output)[0]));

  {
    int lix(fft_length_);
    int lmx(half_fft_length_);
    int lf(1);
    while (1 < lmx) {
      const double* sinp(&(sine_table_[0]));
      const double* cosp(&(sine_table_[0]) + fft_length_ / 4);
      for (int i(0); i < lmx; ++i) {
        double* xpi(&(x[i]));
        double* ypi(&(y[i]));
        for (int li(lix); li <= fft_length_; li += lix) {
          const double t1(*(xpi) - *(xpi + lmx));
          const double t2(*(ypi) - *(ypi + lmx));
          *(xpi) += *(xpi + lmx);
          *(ypi) += *(ypi + lmx);
          *(xpi + lmx) = *cosp * t1 + *sinp * t2;
          *(ypi + lmx) = *cosp * t2 - *sinp * t1;
          xpi += lix;
          ypi += lix;
        }
        sinp += lf;
        cosp += lf;
      }
      lix = lmx;
      lmx /= 2;
      lf *= 2;
    }
  }

  {
    double* xp(x);
    double* yp(y);
    for (int li(0); li < half_fft_length_; ++li) {
      const double t1(*(xp) - *(xp + 1));
      const double t2(*(yp) - *(yp + 1));
      *(xp) += *(xp + 1);
      *(yp) += *(yp + 1);
      *(xp + 1) = t1;
      *(yp + 1) = t2;
      xp += 2;
      yp += 2;
    }
  }

  // Bit reversal.
  {
    double* xp(x);
    double* yp(y);
    const int dec_fft_length(fft_length_ - 1);
    for (int lmx(0), j(0); lmx < dec_fft_length; ++lmx) {
      const int lmxj(lmx - j);
      if (lmxj < 0) {
        const double t1(*(xp));
        const double t2(*(yp));
        *(xp) = *(xp + lmxj);
        *(yp) = *(yp + lmxj);
        *(xp + lmxj) = t1;
        *(yp + lmxj) = t2;
      }

      int li(half_fft_length_);
      while (li <= j) {
        j -= li;
        li /= 2;
      }
      j += li;
      xp = x + j;
      yp = y + j;
    }
  }

  return true;
}